

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemNamesSink::fillInMissing(AppendItemNamesSink *this)

{
  DateTimePatternGenerator *pDVar1;
  char16_t ch;
  long lVar2;
  UnicodeString *this_00;
  long lVar3;
  long lVar4;
  int32_t i;
  ulong uVar5;
  bool bVar6;
  UnicodeString local_70;
  
  lVar3 = 0x508;
  for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
    if (*(ushort *)(&this->dtpg->field_0x510 + uVar5 * 0xc0) < 0x20) {
      this_00 = (UnicodeString *)(&this->dtpg->field_0x508 + uVar5 * 0xc0);
      icu_63::UnicodeString::operator=(this_00,L'F');
      if (uVar5 < 10) {
        ch = (ushort)uVar5 | 0x30;
      }
      else {
        icu_63::UnicodeString::operator+=(this_00,L'1');
        ch = (ushort)uVar5 + L'&';
      }
      icu_63::UnicodeString::operator+=(this_00,ch);
      icu_63::UnicodeString::getTerminatedBuffer(this_00);
    }
    lVar2 = 2;
    lVar4 = lVar3;
    while (bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
      pDVar1 = this->dtpg;
      if (*(ushort *)((pDVar1->pLocale).fullNameBuffer + lVar4 + 0x10) < 0x20) {
        icu_63::UnicodeString::UnicodeString
                  (&local_70,(UnicodeString *)((pDVar1->pLocale).language + lVar4 + -0x10));
        icu_63::UnicodeString::moveFrom
                  ((UnicodeString *)((pDVar1->pLocale).fullNameBuffer + lVar4 + 8),&local_70);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      lVar4 = lVar4 + 0x40;
    }
    lVar3 = lVar3 + 0xc0;
  }
  return;
}

Assistant:

void fillInMissing() {
        for (int32_t i = 0; i < UDATPG_FIELD_COUNT; i++) {
            UnicodeString& valueStr = dtpg.getMutableFieldDisplayName((UDateTimePatternField)i, UDATPG_WIDE);
            if (valueStr.isEmpty()) {
                valueStr = CAP_F;
                U_ASSERT(i < 20);
                if (i < 10) {
                    // F0, F1, ..., F9
                    valueStr += (UChar)(i+0x30);
                } else {
                    // F10, F11, ...
                    valueStr += (UChar)0x31;
                    valueStr += (UChar)(i-10 + 0x30);
                }
                // NUL-terminate for the C API.
                valueStr.getTerminatedBuffer();
            }
            for (int32_t j = 1; j < UDATPG_WIDTH_COUNT; j++) {
                UnicodeString& valueStr2 = dtpg.getMutableFieldDisplayName((UDateTimePatternField)i, (UDateTimePGDisplayWidth)j);
                if (valueStr2.isEmpty()) {
                    valueStr2 = dtpg.getFieldDisplayName((UDateTimePatternField)i, (UDateTimePGDisplayWidth)(j-1));
                }
            }
        }
    }